

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

Instruction ** __thiscall
Hpipe::Vec<Hpipe::Instruction*>::push_back<Hpipe::Instruction*&>
          (Vec<Hpipe::Instruction*> *this,Instruction **args)

{
  iterator __position;
  long lVar1;
  
  __position._M_current = *(Instruction ***)(this + 8);
  if (__position._M_current == *(Instruction ***)(this + 0x10)) {
    std::vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>>::
    _M_realloc_insert<Hpipe::Instruction*&>
              ((vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>> *)this,__position,
               args);
    lVar1 = *(long *)(this + 8);
  }
  else {
    *__position._M_current = *args;
    lVar1 = *(long *)(this + 8) + 8;
    *(long *)(this + 8) = lVar1;
  }
  return (Instruction **)(lVar1 + -8);
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }